

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O1

string * vkt::tessellation::anon_unknown_2::generateGeometryShader
                   (string *__return_storage_ptr__,TessPrimitiveType primitiveType,
                   string *colorSourceName)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  ostringstream src;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"#extension GL_EXT_geometry_shader : require\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"layout(",7);
  if (primitiveType < TESSPRIMITIVETYPE_ISOLINES) {
    pcVar2 = "triangles";
LAB_007d2cae:
    bVar1 = false;
  }
  else {
    if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
      pcVar2 = "lines";
      goto LAB_007d2cae;
    }
    bVar1 = true;
    pcVar2 = (char *)0x0;
  }
  if (bVar1) {
    std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"layout(",7);
  if (primitiveType < TESSPRIMITIVETYPE_ISOLINES) {
    pcVar2 = "triangle_strip";
LAB_007d2d29:
    bVar1 = false;
  }
  else {
    if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
      pcVar2 = "line_strip";
      goto LAB_007d2d29;
    }
    bVar1 = true;
    pcVar2 = (char *)0x0;
  }
  if (bVar1) {
    std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", max_vertices=",0xf);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (local_1a8,(uint)(primitiveType == TESSPRIMITIVETYPE_ISOLINES) * 3 + 8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") out;\n",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"layout(location = 0) in  highp vec4 ",0x24);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(colorSourceName->_M_dataplus)._M_p,colorSourceName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[];\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"layout(location = 0) out highp vec4 v_fragment_color;\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
  if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "\tvec4 centerPos = (gl_in[0].gl_Position + gl_in[1].gl_Position + gl_in[2].gl_Position) / 3.0f;\n"
               ,0x5f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tfor (int ndx = 0; ndx < 4; ++ndx)\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\t{\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "\t\tgl_Position = centerPos + (centerPos - gl_in[ndx % 3].gl_Position);\n",0x46);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\t\tv_fragment_color = ",0x15);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(colorSourceName->_M_dataplus)._M_p,
                        colorSourceName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ndx % 3];\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\tEmitVertex();\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               "\t\tgl_Position = centerPos + 0.7 * (centerPos - gl_in[ndx % 3].gl_Position);\n",
               0x4c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\tv_fragment_color = ",0x15);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(colorSourceName->_M_dataplus)._M_p,colorSourceName->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ndx % 3];\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\tEmitVertex();\n",0x10);
  }
  else {
    if (primitiveType != TESSPRIMITIVETYPE_ISOLINES) goto LAB_007d307e;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "\tvec4 mdir = vec4(gl_in[0].gl_Position.y - gl_in[1].gl_Position.y, gl_in[1].gl_Position.x - gl_in[0].gl_Position.x, 0.0, 0.0);\n"
               ,0x7f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tfor (int i = 0; i <= 10; ++i)\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\t{\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\t\tfloat xweight = cos(float(i) / 10.0 * 6.28) * 0.5 + 0.5;\n"
               ,0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\t\tfloat mweight = sin(float(i) / 10.0 * 6.28) * 0.1 + 0.1;\n"
               ,0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "\t\tgl_Position = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, xweight) + mweight * mdir;\n"
               ,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\t\tv_fragment_color = mix(",0x19);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(colorSourceName->_M_dataplus)._M_p,
                        colorSourceName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[0], ",5);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(colorSourceName->_M_dataplus)._M_p,colorSourceName->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[1], xweight);\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\tEmitVertex();\n",0x10);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t}\n",3);
LAB_007d307e:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string generateGeometryShader (const TessPrimitiveType primitiveType, const std::string& colorSourceName)
{
	const int numEmitVertices = (primitiveType == TESSPRIMITIVETYPE_ISOLINES ? 11 : 8);

	std::ostringstream src;
	src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
		<< "#extension GL_EXT_geometry_shader : require\n"
		<< "layout(" << getGeometryShaderInputPrimitiveTypeShaderName(primitiveType, false) << ") in;\n"
		<< "layout(" << getGeometryShaderOutputPrimitiveTypeShaderName(primitiveType, false)
					  << ", max_vertices=" << numEmitVertices << ") out;\n"
		<< "\n"
		<< "layout(location = 0) in  highp vec4 " << colorSourceName << "[];\n"
		<< "layout(location = 0) out highp vec4 v_fragment_color;\n"
		<< "\n"
		<< "void main (void)\n"
		<< "{\n";

	if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
	{
		src << "	vec4 centerPos = (gl_in[0].gl_Position + gl_in[1].gl_Position + gl_in[2].gl_Position) / 3.0f;\n"
			<< "\n"
			<< "	for (int ndx = 0; ndx < 4; ++ndx)\n"
			<< "	{\n"
			<< "		gl_Position = centerPos + (centerPos - gl_in[ndx % 3].gl_Position);\n"
			<< "		v_fragment_color = " << colorSourceName << "[ndx % 3];\n"
			<< "		EmitVertex();\n"
			<< "\n"
			<< "		gl_Position = centerPos + 0.7 * (centerPos - gl_in[ndx % 3].gl_Position);\n"
			<< "		v_fragment_color = " << colorSourceName << "[ndx % 3];\n"
			<< "		EmitVertex();\n"
			<< "	}\n";
	}
	else if (primitiveType == TESSPRIMITIVETYPE_ISOLINES)
	{
		src << "	vec4 mdir = vec4(gl_in[0].gl_Position.y - gl_in[1].gl_Position.y, gl_in[1].gl_Position.x - gl_in[0].gl_Position.x, 0.0, 0.0);\n"
			<< "	for (int i = 0; i <= 10; ++i)\n"
			<< "	{\n"
			<< "		float xweight = cos(float(i) / 10.0 * 6.28) * 0.5 + 0.5;\n"
			<< "		float mweight = sin(float(i) / 10.0 * 6.28) * 0.1 + 0.1;\n"
			<< "		gl_Position = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, xweight) + mweight * mdir;\n"
			<< "		v_fragment_color = mix(" << colorSourceName << "[0], " << colorSourceName << "[1], xweight);\n"
			<< "		EmitVertex();\n"
			<< "	}\n";
	}
	else
		DE_ASSERT(false);

	src << "}\n";

	return src.str();
}